

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *
cfd::TransactionContext::CheckMultisig
          (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__return_storage_ptr__,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          Script *redeem_script)

{
  pointer pSVar1;
  char cVar2;
  bool bVar3;
  iterator __position;
  CfdException *pCVar4;
  pointer pSVar5;
  pointer pPVar6;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  Pubkey related_pubkey;
  string pubkey_hex;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  undefined1 local_c8 [32];
  SignParameter sign_param;
  
  pSVar5 = (sign_list->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (sign_list->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pSVar5 == pSVar1) || (0xf < (ulong)(((long)pSVar1 - (long)pSVar5) / 0x78))) {
    sign_param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start = "cfd_transaction.cpp";
    sign_param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish._0_4_ = 0x2dc;
    sign_param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = "CheckMultisig";
    core::logger::warn<unsigned_int_const&>
              ((CfdSourceLocation *)&sign_param,"Failed to CheckMultisig. sign array is \'1 - {}\'."
               ,&kMaximumMultisigKeyNum);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&sign_param,"Value out of range. sign array length fail.",
               (allocator *)&pubkey_hex);
    core::CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)&sign_param);
    __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript((Script *)&pubkeys,(uint *)redeem_script);
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (&sign_params,sign_list);
  pPVar6 = pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl
           .super__Vector_impl_data._M_start;
  do {
    if (pPVar6 == pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      pSVar5 = sign_params.
               super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
               super__Vector_impl_data._M_start;
      while( true ) {
        if (pSVar5 == sign_params.
                      super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                    (&sign_params);
          std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&pubkeys);
          return __return_storage_ptr__;
        }
        SignParameter::GetRelatedPubkey((Pubkey *)&sign_param,pSVar5);
        cVar2 = cfd::core::Pubkey::IsValid();
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sign_param);
        if (cVar2 != '\0') break;
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                  (__return_storage_ptr__,pSVar5);
        pSVar5 = pSVar5 + 1;
      }
      local_c8._0_8_ = "cfd_transaction.cpp";
      local_c8._8_4_ = 0x2fe;
      local_c8._16_8_ = "CheckMultisig";
      SignParameter::GetRelatedPubkey(&related_pubkey,pSVar5);
      cfd::core::Pubkey::GetHex_abi_cxx11_();
      cfd::core::Script::GetHex_abi_cxx11_();
      core::logger::warn<std::__cxx11::string,std::__cxx11::string_const>
                ((CfdSourceLocation *)local_c8,
                 "Failed to CheckMultisig. Missing related pubkey in script.: relatedPubkey={}, script={}"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sign_param,
                 &pubkey_hex);
      std::__cxx11::string::~string((string *)&pubkey_hex);
      std::__cxx11::string::~string((string *)&sign_param);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&related_pubkey);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&sign_param,
                 "Missing related pubkey in script. Check your signature and pubkey pair.",
                 (allocator *)&pubkey_hex);
      core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&sign_param);
      __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    cfd::core::Pubkey::GetHex_abi_cxx11_();
    __position._M_current =
         sign_params.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    while (__position._M_current !=
           sign_params.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
      SignParameter::SignParameter(&sign_param,__position._M_current);
      SignParameter::GetRelatedPubkey(&related_pubkey,&sign_param);
      cVar2 = cfd::core::Pubkey::IsValid();
      if (cVar2 == '\0') {
LAB_0020e02a:
        __position._M_current = __position._M_current + 1;
      }
      else {
        cfd::core::Pubkey::GetHex_abi_cxx11_();
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8,&pubkey_hex);
        std::__cxx11::string::~string((string *)local_c8);
        if (bVar3) goto LAB_0020e02a;
        __position = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::erase
                               (&sign_params,__position._M_current);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                  (__return_storage_ptr__,&sign_param);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&related_pubkey);
      SignParameter::~SignParameter(&sign_param);
    }
    std::__cxx11::string::~string((string *)&pubkey_hex);
    pPVar6 = pPVar6 + 1;
  } while( true );
}

Assistant:

std::vector<SignParameter> TransactionContext::CheckMultisig(
    const std::vector<SignParameter>& sign_list, const Script& redeem_script) {
  // check signData (too much data)
  if (sign_list.empty() || (sign_list.size() > kMaximumMultisigKeyNum)) {
    warn(
        CFD_LOG_SOURCE, "Failed to CheckMultisig. sign array is '1 - {}'.",
        kMaximumMultisigKeyNum);
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Value out of range. sign array length fail.");
  }

  // check multisig format and extract pubkey.
  std::vector<Pubkey> pubkeys =
      ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script);

  std::vector<SignParameter> signature_list;
  std::vector<SignParameter> sign_params = sign_list;
  for (const Pubkey& pubkey : pubkeys) {
    std::string pubkey_hex = pubkey.GetHex();
    for (auto itr = sign_params.begin(); itr != sign_params.end();) {
      SignParameter sign_param = *itr;
      Pubkey related_pubkey = sign_param.GetRelatedPubkey();
      if ((!related_pubkey.IsValid()) ||
          (related_pubkey.GetHex() != pubkey_hex)) {
        ++itr;
        continue;
      }

      itr = sign_params.erase(itr);
      signature_list.push_back(sign_param);
    }
  }

  // set the others to signature data
  for (const auto& sign_param : sign_params) {
    // related pubkey not found in script
    if (sign_param.GetRelatedPubkey().IsValid()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CheckMultisig. Missing related pubkey"
          " in script.: relatedPubkey={}, script={}",
          sign_param.GetRelatedPubkey().GetHex(), redeem_script.GetHex());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Missing related pubkey in script."
          " Check your signature and pubkey pair.");
    }
    signature_list.push_back(sign_param);
  }

  return signature_list;
}